

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O1

size_t __thiscall
backward::StackTraceImpl<backward::system_tag::linux_tag>::load_here
          (StackTraceImpl<backward::system_tag::linux_tag> *this,size_t depth,void *context,
          void *error_addr)

{
  vector<void_*,_std::allocator<void_*>_> *this_00;
  size_t sVar1;
  StackTraceImpl<backward::system_tag::linux_tag> *local_40;
  StackTraceImpl<backward::system_tag::linux_tag> **local_38;
  size_type local_30;
  size_t local_28;
  
  StackTraceImplBase::load_thread_info((StackTraceImplBase *)this);
  (this->super_StackTraceImplHolder).super_StackTraceImplBase._context = context;
  (this->super_StackTraceImplHolder).super_StackTraceImplBase._error_addr = error_addr;
  if (depth == 0) {
    sVar1 = 0;
  }
  else {
    this_00 = &(this->super_StackTraceImplHolder)._stacktrace;
    std::vector<void_*,_std::allocator<void_*>_>::resize(this_00,depth);
    local_38 = &local_40;
    local_30 = 0xffffffffffffffff;
    local_40 = this;
    local_28 = depth;
    _Unwind_Backtrace(details::
                      Unwinder<backward::StackTraceImpl<backward::system_tag::linux_tag>::callback>
                      ::backtrace_trampoline,&local_38);
    std::vector<void_*,_std::allocator<void_*>_>::resize(this_00,local_30);
    (this->super_StackTraceImplHolder).super_StackTraceImplBase._skip = 0;
    sVar1 = (long)(this->super_StackTraceImplHolder)._stacktrace.
                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->super_StackTraceImplHolder)._stacktrace.
                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
  }
  return sVar1;
}

Assistant:

NOINLINE
  size_t load_here(size_t depth = 32, void *context = nullptr,
                   void *error_addr = nullptr) {
    load_thread_info();
    set_context(context);
    set_error_addr(error_addr);
    if (depth == 0) {
      return 0;
    }
    _stacktrace.resize(depth);
    size_t trace_cnt = details::unwind(callback(*this), depth);
    _stacktrace.resize(trace_cnt);
    skip_n_firsts(0);
    return size();
  }